

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQClass::Mark(SQClass *this,SQCollectable **chain)

{
  _func_int **pp_Var1;
  long *plVar2;
  SQUnsignedInteger SVar3;
  SQObjectPtr *pSVar4;
  SQCollectable_conflict **in_RSI;
  SQCollectable_conflict *in_RDI;
  SQUnsignedInteger k;
  SQUnsignedInteger j;
  SQUnsignedInteger i;
  SQCollectable_conflict **in_stack_ffffffffffffffb8;
  SQObjectPtr *in_stack_ffffffffffffffc0;
  byte *o;
  ulong local_28;
  byte *local_20;
  ulong local_18;
  
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    (in_RDI->super_SQRefCounted)._uiRef = (in_RDI->super_SQRefCounted)._uiRef | 0x80000000;
    pp_Var1 = in_RDI[1].super_SQRefCounted._vptr_SQRefCounted;
    (**(code **)(*pp_Var1 + 0x20))(pp_Var1,in_RSI);
    if (in_RDI[1].super_SQRefCounted._uiRef != 0) {
      plVar2 = (long *)in_RDI[1].super_SQRefCounted._uiRef;
      (**(code **)(*plVar2 + 0x20))(plVar2,in_RSI);
    }
    SQSharedState::MarkObject(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_18 = 0;
    while( true ) {
      SVar3 = sqvector<SQClassMember>::size
                        ((sqvector<SQClassMember> *)&in_RDI[1].super_SQRefCounted._weakref);
      if (SVar3 <= local_18) break;
      sqvector<SQClassMember>::operator[]
                ((sqvector<SQClassMember> *)&in_RDI[1].super_SQRefCounted._weakref,local_18);
      SQSharedState::MarkObject(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      sqvector<SQClassMember>::operator[]
                ((sqvector<SQClassMember> *)&in_RDI[1].super_SQRefCounted._weakref,local_18);
      SQSharedState::MarkObject(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_18 = local_18 + 1;
    }
    local_20 = (byte *)0x0;
    while( true ) {
      o = local_20;
      pSVar4 = (SQObjectPtr *)
               sqvector<SQClassMember>::size((sqvector<SQClassMember> *)&in_RDI[1]._sharedstate);
      if (pSVar4 <= o) break;
      sqvector<SQClassMember>::operator[]
                ((sqvector<SQClassMember> *)&in_RDI[1]._sharedstate,(SQUnsignedInteger)local_20);
      SQSharedState::MarkObject((SQObjectPtr *)o,in_stack_ffffffffffffffb8);
      sqvector<SQClassMember>::operator[]
                ((sqvector<SQClassMember> *)&in_RDI[1]._sharedstate,(SQUnsignedInteger)local_20);
      SQSharedState::MarkObject((SQObjectPtr *)o,in_stack_ffffffffffffffb8);
      local_20 = local_20 + 1;
    }
    for (local_28 = 0; local_28 < 0x12; local_28 = local_28 + 1) {
      SQSharedState::MarkObject((SQObjectPtr *)o,in_stack_ffffffffffffffb8);
    }
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
    SQCollectable::AddToChain(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void SQClass::Mark(SQCollectable **chain)
{
    START_MARK()
        _members->Mark(chain);
        if(_base) _base->Mark(chain);
        SQSharedState::MarkObject(_attributes, chain);
        for(SQUnsignedInteger i =0; i< _defaultvalues.size(); i++) {
            SQSharedState::MarkObject(_defaultvalues[i].val, chain);
            SQSharedState::MarkObject(_defaultvalues[i].attrs, chain);
        }
        for(SQUnsignedInteger j =0; j< _methods.size(); j++) {
            SQSharedState::MarkObject(_methods[j].val, chain);
            SQSharedState::MarkObject(_methods[j].attrs, chain);
        }
        for(SQUnsignedInteger k =0; k< MT_LAST; k++) {
            SQSharedState::MarkObject(_metamethods[k], chain);
        }
    END_MARK()
}